

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

int64_t __thiscall leveldb::DBImpl::TEST_MaxNextLevelOverlappingBytes(DBImpl *this)

{
  long lVar1;
  int64_t iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&(this->mutex_).mu_);
  iVar2 = VersionSet::MaxNextLevelOverlappingBytes(this->versions_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int64_t DBImpl::TEST_MaxNextLevelOverlappingBytes() {
  MutexLock l(&mutex_);
  return versions_->MaxNextLevelOverlappingBytes();
}